

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

int secp256k1_modinv64_mul_cmp_62
              (secp256k1_modinv64_signed62 *a,int alen,secp256k1_modinv64_signed62 *b,int64_t factor
              )

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  secp256k1_modinv64_signed62 *psVar9;
  long lVar10;
  ulong uVar11;
  long *extraout_RDX;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  secp256k1_modinv64_signed62 *b_00;
  long lVar16;
  secp256k1_modinv64_signed62 *psVar17;
  secp256k1_modinv64_signed62 *a_00;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  secp256k1_modinv64_signed62 bm;
  secp256k1_modinv64_signed62 am;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_modinv64_signed62 local_40;
  
  a_00 = &local_68;
  secp256k1_modinv64_mul_62(&local_40,a,alen,1);
  secp256k1_modinv64_mul_62(&local_68,b,5,factor);
  lVar4 = 0;
  while ((ulong)local_40.v[lVar4] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)local_68.v[lVar4]) goto LAB_00142f01;
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      uVar2 = 4;
      while( true ) {
        if (local_40.v[uVar2] < local_68.v[uVar2]) {
          return -1;
        }
        if (local_68.v[uVar2] < local_40.v[uVar2]) break;
        bVar23 = uVar2 == 0;
        uVar2 = uVar2 - 1;
        if (bVar23) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142f01:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar3 = (int)a_00;
  if (iVar3 < 1) {
LAB_001431c0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_001431c5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_001431ca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_001431cf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_001431d4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_001431d9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar4 = *(long *)factor;
    lVar1 = *(long *)(factor + 8);
    lVar19 = b->v[0];
    lVar14 = *extraout_RDX;
    uVar5 = lVar19 * lVar4;
    lVar12 = SUB168(SEXT816(lVar19) * SEXT816(lVar4),8);
    uVar6 = lVar14 * lVar1;
    lVar13 = SUB168(SEXT816(lVar14) * SEXT816(lVar1),8);
    lVar10 = (0x7fffffffffffffff - lVar13) - lVar12;
    if (-1 < lVar13 &&
        (SBORROW8(0x7fffffffffffffff - lVar13,lVar12) != SBORROW8(lVar10,(ulong)(~uVar6 < uVar5)))
        != (long)(lVar10 - (ulong)(~uVar6 < uVar5)) < 0) goto LAB_001431c5;
    lVar10 = *(long *)(factor + 0x10);
    lVar18 = lVar13 + lVar12 + (ulong)CARRY8(uVar6,uVar5);
    lVar12 = *(long *)(factor + 0x18);
    uVar7 = lVar19 * lVar10;
    lVar13 = SUB168(SEXT816(lVar19) * SEXT816(lVar10),8);
    uVar8 = lVar14 * lVar12;
    lVar14 = SUB168(SEXT816(lVar14) * SEXT816(lVar12),8);
    uVar20 = (ulong)(-uVar8 - 1 < uVar7);
    lVar19 = (0x7fffffffffffffff - lVar14) - lVar13;
    if (-1 < lVar14 &&
        (SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar19,uVar20)) !=
        (long)(lVar19 - uVar20) < 0) goto LAB_001431ca;
    lVar19 = lVar14 + lVar13 + (ulong)CARRY8(uVar8,uVar7);
    if ((uVar6 + uVar5 & 0x3fffffffffffffff) != 0) goto LAB_001431cf;
    if ((uVar8 + uVar7 & 0x3fffffffffffffff) != 0) goto LAB_001431d4;
    uVar20 = uVar8 + uVar7 >> 0x3e | lVar19 * 4;
    uVar5 = uVar6 + uVar5 >> 0x3e | lVar18 * 4;
    lVar19 = lVar19 >> 0x3e;
    lVar18 = lVar18 >> 0x3e;
    if (iVar3 != 1) {
      psVar9 = (secp256k1_modinv64_signed62 *)((ulong)a_00 & 0xffffffff);
      a_00 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar14 = b->v[(long)a_00];
        uVar7 = lVar14 * lVar4 + uVar5;
        lVar16 = SUB168(SEXT816(lVar14) * SEXT816(lVar4),8) + lVar18 +
                 (ulong)CARRY8(lVar14 * lVar4,uVar5);
        lVar13 = extraout_RDX[(long)a_00];
        uVar6 = lVar13 * lVar1;
        lVar15 = SUB168(SEXT816(lVar13) * SEXT816(lVar1),8);
        uVar5 = (ulong)(-uVar6 - 1 < uVar7);
        lVar18 = (0x7fffffffffffffff - lVar15) - lVar16;
        psVar17 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar21 = (-0x8000000000000000 - lVar15) - (ulong)(uVar6 != 0);
        lVar22 = lVar16 - lVar21;
        bVar23 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar16) != SBORROW8(lVar18,uVar5)) ==
                 (long)(lVar18 - uVar5) < 0;
        if (lVar15 < 0) {
          bVar23 = (SBORROW8(lVar16,lVar21) != SBORROW8(lVar22,(ulong)(uVar7 < -uVar6))) ==
                   (long)(lVar22 - (ulong)(uVar7 < -uVar6)) < 0;
        }
        if (!bVar23) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_001431bb:
          b = psVar17;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_001431c0;
        }
        uVar11 = lVar14 * lVar10 + uVar20;
        lVar22 = SUB168(SEXT816(lVar14) * SEXT816(lVar10),8) + lVar19 +
                 (ulong)CARRY8(lVar14 * lVar10,uVar20);
        uVar8 = lVar13 * lVar12;
        lVar13 = SUB168(SEXT816(lVar13) * SEXT816(lVar12),8);
        uVar5 = (ulong)(-uVar8 - 1 < uVar11);
        lVar19 = (0x7fffffffffffffff - lVar13) - lVar22;
        lVar18 = (-0x8000000000000000 - lVar13) - (ulong)(uVar8 != 0);
        lVar14 = lVar22 - lVar18;
        bVar23 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar22) != SBORROW8(lVar19,uVar5)) ==
                 (long)(lVar19 - uVar5) < 0;
        if (lVar13 < 0) {
          bVar23 = (SBORROW8(lVar22,lVar18) != SBORROW8(lVar14,(ulong)(uVar11 < -uVar8))) ==
                   (long)(lVar14 - (ulong)(uVar11 < -uVar8)) < 0;
        }
        if (!bVar23) goto LAB_001431bb;
        lVar18 = lVar15 + lVar16 + (ulong)CARRY8(uVar6,uVar7);
        lVar19 = lVar13 + lVar22 + (ulong)CARRY8(uVar8,uVar11);
        uVar5 = lVar18 * 4 | uVar6 + uVar7 >> 0x3e;
        b->v[(long)((long)a_00[-1].v + 0x27)] = uVar6 + uVar7 & 0x3fffffffffffffff;
        uVar20 = lVar19 * 4 | uVar8 + uVar11 >> 0x3e;
        extraout_RDX[(long)((long)a_00[-1].v + 0x27)] = uVar8 + uVar11 & 0x3fffffffffffffff;
        a_00 = (secp256k1_modinv64_signed62 *)((long)a_00->v + 1);
        lVar19 = lVar19 >> 0x3e;
        lVar18 = lVar18 >> 0x3e;
      } while (psVar9 != a_00);
    }
    if (lVar18 + -1 + (ulong)(0x7fffffffffffffff < uVar5) != -1) goto LAB_001431d9;
    b->v[(long)iVar3 + -1] = uVar5;
    if (lVar19 + -1 + (ulong)(0x7fffffffffffffff < uVar20) == -1) {
      lVar4 = (long)iVar3 + -1;
      extraout_RDX[lVar4] = uVar20;
      return (int)lVar4;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar4 = a_00->v[0];
  lVar1 = a_00->v[1];
  psVar9 = (secp256k1_modinv64_signed62 *)a_00->v[2];
  lVar19 = a_00->v[3];
  lVar14 = a_00->v[4];
  lVar10 = 0;
  do {
    if (a_00->v[lVar10] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
      psVar17 = psVar9;
LAB_0014340f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00143414;
    }
    psVar17 = psVar9;
    if (0x3fffffffffffffff < a_00->v[lVar10]) goto LAB_0014340f;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  psVar17 = a_00;
  iVar3 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,-2);
  if (iVar3 < 1) {
LAB_00143414:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00143419:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014341e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    psVar17 = a_00;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,1);
    if (-1 < iVar3) goto LAB_00143419;
    uVar5 = lVar14 >> 0x3f;
    uVar7 = (long)b >> 0x3f;
    uVar6 = ((uVar5 & b_00->v[0]) + lVar4 ^ uVar7) - uVar7;
    uVar8 = ((long)uVar6 >> 0x3e) + (((uVar5 & b_00->v[1]) + lVar1 ^ uVar7) - uVar7);
    uVar11 = ((long)uVar8 >> 0x3e) + (((long)psVar9->v + (uVar5 & b_00->v[2]) ^ uVar7) - uVar7);
    uVar20 = ((long)uVar11 >> 0x3e) + (((uVar5 & b_00->v[3]) + lVar19 ^ uVar7) - uVar7);
    lVar4 = ((long)uVar20 >> 0x3e) + (((uVar5 & b_00->v[4]) + lVar14 ^ uVar7) - uVar7);
    uVar7 = lVar4 >> 0x3f;
    uVar5 = (b_00->v[0] & uVar7) + (uVar6 & 0x3fffffffffffffff);
    psVar17 = (secp256k1_modinv64_signed62 *)((b_00->v[4] & uVar7) + lVar4);
    uVar8 = ((long)uVar5 >> 0x3e) + (b_00->v[1] & uVar7) + (uVar8 & 0x3fffffffffffffff);
    uVar6 = ((long)uVar8 >> 0x3e) + (b_00->v[2] & uVar7) + (uVar11 & 0x3fffffffffffffff);
    uVar20 = ((long)uVar6 >> 0x3e) + (b_00->v[3] & uVar7) + (uVar20 & 0x3fffffffffffffff);
    uVar7 = (long)psVar17->v + ((long)uVar20 >> 0x3e);
    a_00->v[0] = uVar5 & 0x3fffffffffffffff;
    a_00->v[1] = uVar8 & 0x3fffffffffffffff;
    a_00->v[2] = uVar6 & 0x3fffffffffffffff;
    a_00->v[3] = uVar20 & 0x3fffffffffffffff;
    a_00->v[4] = uVar7;
    if (0x3fffffffffffffff < uVar7) goto LAB_0014341e;
    psVar17 = a_00;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,0);
    if (-1 < iVar3) {
      iVar3 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,1);
      if (iVar3 < 0) {
        return iVar3;
      }
      goto LAB_00143428;
    }
  }
  a_00 = psVar17;
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00143428:
  secp256k1_modinv64_normalize_62_cold_1();
  if ((long)a_00 < 1) {
    a_00 = (secp256k1_modinv64_signed62 *)-(long)a_00;
  }
  return (int)a_00;
}

Assistant:

static int secp256k1_modinv64_mul_cmp_62(const secp256k1_modinv64_signed62 *a, int alen, const secp256k1_modinv64_signed62 *b, int64_t factor) {
    int i;
    secp256k1_modinv64_signed62 am, bm;
    secp256k1_modinv64_mul_62(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv64_mul_62(&bm, b, 5, factor);
    for (i = 0; i < 4; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 62 == 0);
        VERIFY_CHECK(bm.v[i] >> 62 == 0);
    }
    for (i = 4; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}